

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_datagram_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  st_quicly_receive_datagram_frame_t *psVar1;
  bool bVar2;
  uint64_t uVar3;
  int iVar4;
  uint8_t *extraout_RDX;
  uint8_t *puVar5;
  ptls_iovec_t pVar6;
  
  if ((((conn->super).ctx)->transport_params).max_datagram_frame_size == 0) {
    return 0x20007;
  }
  puVar5 = state->end;
  if (state->frame_type == 0x31) {
    uVar3 = ptls_decode_quicint(&state->src,puVar5);
    iVar4 = 0x20007;
    if ((uVar3 == 0xffffffffffffffff) || ((ulong)((long)puVar5 - (long)state->src) < uVar3)) {
      bVar2 = false;
      puVar5 = extraout_RDX;
      goto LAB_00128307;
    }
  }
  else {
    uVar3 = (long)puVar5 - (long)state->src;
  }
  puVar5 = state->src;
  state->src = puVar5 + uVar3;
  iVar4 = 0;
  bVar2 = true;
LAB_00128307:
  if (bVar2) {
    psVar1 = ((conn->super).ctx)->receive_datagram_frame;
    pVar6.len = uVar3;
    pVar6.base = puVar5;
    (*psVar1->cb)(psVar1,conn,pVar6);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int handle_datagram_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_datagram_frame_t frame;
    int ret;

    /* check if we advertised support for DATAGRAM frames on this connection */
    if (conn->super.ctx->transport_params.max_datagram_frame_size == 0)
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    /* decode the frame */
    if ((ret = quicly_decode_datagram_frame(state->frame_type, &state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(DATAGRAM_RECEIVE, conn, conn->stash.now, frame.payload.base, frame.payload.len);

    /* handle the frame. Applications might call quicly_close or other functions that modify the connection state. */
    conn->super.ctx->receive_datagram_frame->cb(conn->super.ctx->receive_datagram_frame, conn, frame.payload);

    return 0;
}